

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::strTree<char_const(&)[10],unsigned_short&,char_const(&)[3],kj::StringTree>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [10],unsigned_short *params_1,
          char (*params_2) [3],StringTree *params_3)

{
  CappedArray<char,_8UL> local_60;
  CappedArray<char,_8UL> local_50;
  kj *local_40;
  char *local_38;
  
  local_38 = (char *)strlen((char *)this);
  local_40 = this;
  local_50 = _::Stringifier::operator*((Stringifier *)&_::STR,*(unsigned_short *)*params);
  local_60.content = (char  [8])strlen((char *)params_1);
  local_60.currentSize = (size_t)params_1;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,(StringTree *)&local_40,(ArrayPtr<const_char> *)&local_50,
             &local_60,(ArrayPtr<const_char> *)params_2,params_3);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}